

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_common.c
# Opt level: O1

char * buffer_merge(Buffer **buffers,size_t n,size_t *_len)

{
  Buffer *pBVar1;
  BufferBlock *pBVar2;
  BufferBlock *pBVar3;
  Buffer *pBVar4;
  char *pcVar5;
  size_t sVar6;
  char *__dest;
  size_t sVar7;
  
  if (n == 0) {
    sVar7 = 0;
    pBVar4 = (Buffer *)0x0;
  }
  else {
    pBVar4 = (Buffer *)0x0;
    sVar7 = 0;
    sVar6 = 0;
    do {
      pBVar1 = buffers[sVar6];
      if (pBVar1 != (Buffer *)0x0) {
        if (pBVar4 == (Buffer *)0x0) {
          pBVar4 = pBVar1;
        }
        sVar7 = sVar7 + pBVar1->total_bytes;
      }
      sVar6 = sVar6 + 1;
    } while (n != sVar6);
  }
  if (pBVar4 == (Buffer *)0x0) {
    pcVar5 = (char *)0x0;
  }
  else {
    pcVar5 = (char *)(*pBVar4->m)((int)sVar7 + 1,pBVar4->d);
  }
  if (pcVar5 == (char *)0x0) {
    *_len = 0;
    pcVar5 = (char *)0x0;
  }
  else {
    *_len = sVar7;
    __dest = pcVar5;
    if (n != 0) {
      sVar6 = 0;
      do {
        pBVar4 = buffers[sVar6];
        if (pBVar4 != (Buffer *)0x0) {
          pBVar3 = pBVar4->head;
          while (pBVar3 != (BufferBlock *)0x0) {
            pBVar2 = pBVar3->next;
            memcpy(__dest,pBVar3->data,pBVar3->bytes);
            __dest = __dest + pBVar3->bytes;
            (*pBVar4->f)(pBVar3,pBVar4->d);
            pBVar3 = pBVar2;
          }
          pBVar4->total_bytes = 0;
          pBVar4->head = (BufferBlock *)0x0;
          pBVar4->tail = (BufferBlock *)0x0;
        }
        sVar6 = sVar6 + 1;
      } while (sVar6 != n);
    }
    *__dest = '\0';
    if (__dest != pcVar5 + sVar7) {
      __assert_fail("ptr == (retval + len)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_common.c"
                    ,0x399,"char *buffer_merge(Buffer **, const size_t, size_t *)");
    }
  }
  return pcVar5;
}

Assistant:

char *buffer_merge(Buffer **buffers, const size_t n, size_t *_len)
{
    Buffer *first = NULL;
    size_t len = 0;
    size_t i;
    for (i = 0; i < n; i++)
    {
        Buffer *buffer = buffers[i];
        if (buffer == NULL)
            continue;
        if (first == NULL)
            first = buffer;
        len += buffer->total_bytes;
    } // for

    char *retval = (char *) (first ? first->m(len + 1, first->d) : NULL);
    if (retval == NULL)
    {
        *_len = 0;
        return NULL;
    } // if

    *_len = len;
    char *ptr = retval;
    for (i = 0; i < n; i++)
    {
        Buffer *buffer = buffers[i];
        if (buffer == NULL)
            continue;
        BufferBlock *item = buffer->head;
        while (item != NULL)
        {
            BufferBlock *next = item->next;
            memcpy(ptr, item->data, item->bytes);
            ptr += item->bytes;
            buffer->f(item, buffer->d);
            item = next;
        } // while

        buffer->head = buffer->tail = NULL;
        buffer->total_bytes = 0;
    } // for
    *ptr = '\0';

    assert(ptr == (retval + len));

    return retval;
}